

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigStrSim.c
# Opt level: O1

void Saig_StrSimTableInsert(Aig_Obj_t **ppTable,Aig_Obj_t **ppNexts,int nTableSize,Aig_Obj_t *pObj)

{
  uint uVar1;
  Aig_Obj_t **ppAVar2;
  long lVar3;
  
  lVar3 = 0;
  uVar1 = 0;
  do {
    uVar1 = uVar1 ^ *(int *)((long)Saig_StrSimHash::s_SPrimes + lVar3) *
                    *(int *)((long)(pObj->field_5).pData + lVar3);
    lVar3 = lVar3 + 4;
  } while (lVar3 != 0x40);
  ppAVar2 = ppTable + (int)(uVar1 % (uint)nTableSize);
  if (*ppAVar2 != (Aig_Obj_t *)0x0) {
    ppNexts[pObj->Id] = ppNexts[(*ppAVar2)->Id];
    ppAVar2 = ppNexts + (*ppAVar2)->Id;
  }
  *ppAVar2 = pObj;
  return;
}

Assistant:

void Saig_StrSimTableInsert( Aig_Obj_t ** ppTable, Aig_Obj_t ** ppNexts, int nTableSize, Aig_Obj_t * pObj )
{
    // find the hash entry
    int iEntry = Saig_StrSimHash( pObj ) % nTableSize;
    // check if there are nodes with this signatures
    if ( ppTable[iEntry] == NULL )
        ppTable[iEntry] = pObj;
    else
    {
        Saig_ObjSetNext( ppNexts, pObj, Saig_ObjNext(ppNexts, ppTable[iEntry]) );
        Saig_ObjSetNext( ppNexts, ppTable[iEntry], pObj );
    }
}